

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  App **ppAVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  Classifier CVar5;
  int iVar6;
  App *pAVar7;
  long lVar8;
  App *pAVar9;
  Option *pOVar10;
  Classifier CVar11;
  string dummy2;
  string dummy1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar6 = ::std::__cxx11::string::compare((char *)current);
  pAVar9 = this;
  if (iVar6 == 0) {
    CVar11 = POSITIONAL_MARK;
    goto LAB_00120dce;
  }
  do {
    if (((pAVar9->require_subcommand_max_ == 0) ||
        ((ulong)((long)(pAVar9->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pAVar9->parsed_subcommands_).
                       super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) < pAVar9->require_subcommand_max_)) ||
       (pAVar9->subcommand_fallthrough_ != true)) {
      pAVar7 = _find_subcommand(pAVar9,current,true,ignore_used_subcommands);
      if (pAVar7 != (App *)0x0) {
        CVar11 = SUBCOMMAND;
        goto LAB_00120dce;
      }
      if (pAVar9->subcommand_fallthrough_ != true) break;
    }
    ppAVar1 = &pAVar9->parent_;
    pAVar9 = *ppAVar1;
  } while (*ppAVar1 != (App *)0x0);
  bVar4 = detail::split_long(current,&local_70,&local_90);
  CVar11 = LONG;
  if (bVar4) goto LAB_00120dce;
  if (((current->_M_string_length < 2) || (pcVar3 = (current->_M_dataplus)._M_p, *pcVar3 != '-')) ||
     (bVar2 = pcVar3[1], bVar2 < 0x22 || bVar2 == 0x2d)) {
    if (this->allow_windows_style_options_ == true) {
      bVar4 = detail::split_windows_style(current,&local_70,&local_90);
      CVar11 = WINDOWS_STYLE;
      if (bVar4) goto LAB_00120dce;
    }
    iVar6 = ::std::__cxx11::string::compare((char *)current);
    if (((iVar6 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar11 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_00120dce;
    lVar8 = ::std::__cxx11::string::find((char)current,0x2e);
    if (lVar8 != -1) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
      pAVar9 = _find_subcommand(this,&local_b0,true,ignore_used_subcommands);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (pAVar9 != (App *)0x0) {
        ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
        CVar5 = _recognize(pAVar9,&local_b0,ignore_used_subcommands);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        CVar11 = SUBCOMMAND;
        if (CVar5 == SUBCOMMAND) goto LAB_00120dce;
      }
    }
LAB_00120d41:
    CVar11 = NONE;
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    bVar2 = *local_70._M_dataplus._M_p;
    if ((char)bVar2 < 0x30) {
      if (((bVar2 == 0x2e) && (local_90._M_string_length != 0)) &&
         ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10)) goto LAB_00120d81;
    }
    else if (bVar2 < 0x3a) {
LAB_00120d81:
      local_50.field_2._M_allocated_capacity._0_2_ = (short)(char)bVar2 << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar10 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (pOVar10 == (Option *)0x0) goto LAB_00120d41;
    }
    CVar11 = SHORT;
  }
LAB_00120dce:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return CVar11;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}